

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tableview.cpp
# Opt level: O0

QSize __thiscall QtMWidgets::MinimumSizeLabel::minimumSizeHint(MinimumSizeLabel *this)

{
  int w;
  bool bVar1;
  bool bVar2;
  byte bVar3;
  long lVar4;
  int *piVar5;
  byte local_8d;
  int local_8c;
  int local_88;
  int local_84;
  int local_80;
  QSize local_7c;
  QSize labelSizeHint;
  QLabel local_48 [24];
  QString local_30;
  MinimumSizeLabel *local_18;
  MinimumSizeLabel *this_local;
  
  local_18 = this;
  QLabel::text();
  bVar2 = QString::isEmpty(&local_30);
  bVar1 = false;
  labelSizeHint.wd._3_1_ = 0;
  local_8d = 0;
  if (bVar2) {
    QLabel::pixmap(local_48,(ReturnByValueConstant)this);
    bVar1 = true;
    bVar3 = QPixmap::isNull();
    local_8d = 0;
    if ((bVar3 & 1) != 0) {
      lVar4 = QLabel::movie();
      local_8d = 0;
      if (lVar4 == 0) {
        QLabel::picture((QLabel *)&labelSizeHint.ht,(ReturnByValueConstant)this);
        labelSizeHint.wd._3_1_ = 1;
        local_8d = QPicture::isNull();
      }
    }
  }
  if ((labelSizeHint.wd._3_1_ & 1) != 0) {
    QPicture::~QPicture((QPicture *)&labelSizeHint.ht);
  }
  if (bVar1) {
    QPixmap::~QPixmap((QPixmap *)local_48);
  }
  QString::~QString(&local_30);
  if ((local_8d & 1) == 0) {
    local_7c = (QSize)QLabel::sizeHint();
    local_80 = QSize::width(&local_7c);
    local_84 = FingerGeometry::width();
    piVar5 = qMax<int>(&local_80,&local_84);
    w = *piVar5;
    local_88 = QSize::height(&local_7c);
    local_8c = FingerGeometry::height();
    piVar5 = qMax<int>(&local_88,&local_8c);
    QSize::QSize((QSize *)&this_local,w,*piVar5);
  }
  else {
    QSize::QSize((QSize *)&this_local,0,0);
  }
  return (QSize)this_local;
}

Assistant:

QSize minimumSizeHint() const override
	{
		if( text().isEmpty() && pixmap( Qt::ReturnByValue ).isNull() && !movie() &&
			picture( Qt::ReturnByValue ).isNull() )
				return QSize( 0, 0 );
		else
		{
			const QSize labelSizeHint = QLabel::sizeHint();

			return QSize( qMax( labelSizeHint.width(), FingerGeometry::width() ),
				qMax( labelSizeHint.height(), FingerGeometry::height() ) );
		}
	}